

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void regenerate(ImGuiWS *imguiWS,int time)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  int i;
  long lVar5;
  value_type *__val;
  
  pcVar2 = (char *)operator_new(0x100);
  lVar5 = 0;
  memset(pcVar2,0,0x100);
  do {
    iVar1 = rand();
    pcVar2[lVar5] = (char)iVar1;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  ImGuiWS::setTexture(imguiWS,g_texture0Id,Gray8,0x10,0x10,pcVar2);
  operator_delete(pcVar2,0x100);
  pcVar2 = (char *)operator_new(0xc00);
  memset(pcVar2,0,0xc00);
  lVar5 = 2;
  iVar1 = time;
  iVar3 = time;
  iVar4 = time;
  do {
    pcVar2[lVar5 + -2] =
         ((char)(uint)((ulong)((long)iVar1 * 0x80808081) >> 0x27) -
         (char)((long)iVar1 * 0x80808081 >> 0x3f)) + (char)iVar1;
    pcVar2[lVar5 + -1] =
         ((char)(uint)((ulong)((long)iVar3 * 0x80808081) >> 0x27) -
         (char)((long)iVar3 * 0x80808081 >> 0x3f)) + (char)iVar3;
    pcVar2[lVar5] =
         ((char)(uint)((ulong)((long)iVar4 * 0x80808081) >> 0x27) -
         (char)((long)iVar4 * 0x80808081 >> 0x3f)) + (char)iVar4;
    iVar4 = iVar4 + 0x13;
    iVar3 = iVar3 + 0xd;
    iVar1 = iVar1 + 10;
    lVar5 = lVar5 + 3;
  } while (lVar5 != 0xc02);
  ImGuiWS::setTexture(imguiWS,g_texture1Id,RGB24,0x20,0x20,pcVar2);
  operator_delete(pcVar2,0xc00);
  pcVar2 = (char *)operator_new(0x4000);
  lVar5 = 0;
  memset(pcVar2,0,0x4000);
  do {
    iVar1 = rand();
    pcVar2[lVar5 * 4] = (char)iVar1;
    iVar1 = rand();
    pcVar2[lVar5 * 4 + 1] = (char)iVar1;
    iVar1 = rand();
    pcVar2[lVar5 * 4 + 2] = (char)iVar1;
    pcVar2[lVar5 * 4 + 3] =
         ((char)(uint)((ulong)((long)time * 0x80808081) >> 0x27) -
         (char)((long)time * 0x80808081 >> 0x3f)) + (char)time;
    lVar5 = lVar5 + 1;
    time = time + 0x13;
  } while (lVar5 != 0x1000);
  ImGuiWS::setTexture(imguiWS,g_texture2Id,RGBA32,0x40,0x40,pcVar2);
  operator_delete(pcVar2,0x4000);
  return;
}

Assistant:

void regenerate(ImGuiWS & imguiWS, int time) {
    {
        // texture sizes must be powers of 2
        int width = 16;
        int height = 16;
        std::vector<char> texture0(width*height);
        for (int i = 0; i < width*height; ++i) {
            texture0[i] = rand()%256;
        }
        imguiWS.setTexture(g_texture0Id, ImGuiWS::Texture::Type::Gray8, width, height, (const char *) texture0.data());
    }

    {
        int width = 32;
        int height = 32;
        std::vector<char> texture0(3*width*height);
        for (int i = 0; i < width*height; ++i) {
            texture0[3*i + 0] = (i*10 + time)%255;
            texture0[3*i + 1] = (i*13 + time)%255;
            texture0[3*i + 2] = (i*19 + time)%255;
        }
        imguiWS.setTexture(g_texture1Id, ImGuiWS::Texture::Type::RGB24, width, height, (const char *) texture0.data());
    }

    {
        int width = 64;
        int height = 64;
        std::vector<char> texture0(4*width*height);
        for (int i = 0; i < width*height; ++i) {
            texture0[4*i + 0] = rand()%256;
            texture0[4*i + 1] = rand()%256;
            texture0[4*i + 2] = rand()%256;
            texture0[4*i + 3] = (i*19 + time)%255;
        }
        imguiWS.setTexture(g_texture2Id, ImGuiWS::Texture::Type::RGBA32, width, height, (const char *) texture0.data());
    }
}